

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testbits.cpp
# Opt level: O1

void testopaque(wins *wins_ar,int ar_len)

{
  long *plVar1;
  long lVar2;
  Am_Image_Array grey2;
  Am_Image_Array local_80 [8];
  Am_Image_Array grey;
  Am_Image_Array local_58 [8];
  Am_Style foo;
  Am_Image_Array local_48 [8];
  Am_Style opaque_style;
  Am_Style grey_style;
  
  if (0 < ar_len) {
    lVar2 = 0;
    do {
      plVar1 = *(long **)((long)&wins_ar->d3 + lVar2);
      (**(code **)(*plVar1 + 0x160))(plVar1,&Am_White,&Am_Blue,10,10,0x19,0x19,0);
      (**(code **)(*plVar1 + 0x160))(plVar1,&Am_White,&Am_Blue,0x1e,0x1e,0x19,0x19,0);
      Am_Image_Array::Am_Image_Array(&grey,0x32);
      Am_Image_Array::Am_Image_Array(local_80,&grey);
      Am_Style::Am_Style((Am_Style *)0x3f800000,0,0,&grey_style,8,1,0,1,&Am_DEFAULT_DASH_LIST,2,2,0,
                         local_80);
      Am_Image_Array::~Am_Image_Array(local_80);
      (**(code **)(*plVar1 + 0x160))(plVar1,&Am_White,&grey_style,10,10,0x19,0x19,0);
      Am_Image_Array::Am_Image_Array(&grey2,10);
      Am_Image_Array::Am_Image_Array(local_48,&grey2);
      Am_Style::Am_Style((Am_Style *)0x3f800000,&opaque_style,8,1,0,1,&Am_DEFAULT_DASH_LIST,2,3,0,
                         local_48);
      Am_Image_Array::~Am_Image_Array(local_48);
      (**(code **)(*plVar1 + 0x160))(plVar1,&Am_White,&opaque_style,0x1e,0x1e,0x19,0x19,0);
      Am_Image_Array::Am_Image_Array(local_58,&grey2);
      Am_Style::Am_Style((Am_Style *)0x3f800000,&foo,8,1,0,1,&Am_DEFAULT_DASH_LIST,2,2,0,local_58);
      Am_Image_Array::~Am_Image_Array(local_58);
      (**(code **)(*plVar1 + 0x160))(plVar1,&Am_White,&foo,0x3c,0x3c,0x19,0x19,0);
      Am_Style::~Am_Style(&foo);
      Am_Style::~Am_Style(&opaque_style);
      Am_Image_Array::~Am_Image_Array(&grey2);
      Am_Style::~Am_Style(&grey_style);
      Am_Image_Array::~Am_Image_Array(&grey);
      lVar2 = lVar2 + 0x40;
    } while ((ulong)(uint)ar_len << 6 != lVar2);
  }
  return;
}

Assistant:

void
testopaque(wins *wins_ar, int ar_len)
{
  for (int i = 0; i < ar_len; i++) {
    Am_Drawonable *d = wins_ar[i].d3;

    d->Draw_Rectangle(Am_White, Am_Blue, 10, 10, 25, 25);

    d->Draw_Rectangle(Am_White, Am_Blue, 30, 30, 25, 25);

    Am_Image_Array grey(50);
    Am_Style grey_style(1.0f, 0.0f, 0.0f, 8, Am_CAP_BUTT, Am_JOIN_MITER,
                        Am_LINE_ON_OFF_DASH, Am_DEFAULT_DASH_LIST,
                        Am_DEFAULT_DASH_LIST_LENGTH, Am_FILL_STIPPLED,
                        Am_FILL_POLY_EVEN_ODD, grey);
    d->Draw_Rectangle(Am_White, grey_style, 10, 10, 25, 25);

    Am_Image_Array grey2(10);
    Am_Style opaque_style(1.0f, 0.0f, 0.0f, 8, Am_CAP_BUTT, Am_JOIN_MITER,
                          Am_LINE_ON_OFF_DASH, Am_DEFAULT_DASH_LIST,
                          Am_DEFAULT_DASH_LIST_LENGTH, Am_FILL_OPAQUE_STIPPLED,
                          Am_FILL_POLY_EVEN_ODD, grey2);
    d->Draw_Rectangle(Am_White, opaque_style, 30, 30, 25, 25);

    Am_Style foo(1.0f, 0.0f, 0.0f, 8, Am_CAP_BUTT, Am_JOIN_MITER,
                 Am_LINE_ON_OFF_DASH, Am_DEFAULT_DASH_LIST,
                 Am_DEFAULT_DASH_LIST_LENGTH, Am_FILL_STIPPLED,
                 Am_FILL_POLY_EVEN_ODD, grey2);

    d->Draw_Rectangle(Am_White, foo, 60, 60, 25, 25);
  }
}